

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthread.cpp
# Opt level: O1

QBindingStatus * __thiscall
QtPrivate::BindingStatusOrList::addObjectUnlessAlreadyStatus
          (BindingStatusOrList *this,QObject *object)

{
  QBindingStatus *pQVar1;
  ulong uVar2;
  iterator __position;
  QBindingStatus *pQVar3;
  vector<QObject*,std::allocator<QObject*>> *this_00;
  long in_FS_OFFSET;
  QObject *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (QBindingStatus *)(this->data).super___atomic_base<unsigned_long_long>._M_i;
  pQVar3 = (QBindingStatus *)0x0;
  if (((ulong)pQVar1 & 1) == 0) {
    pQVar3 = pQVar1;
  }
  local_20 = object;
  if (pQVar3 == (QBindingStatus *)0x0) {
    uVar2 = (this->data).super___atomic_base<unsigned_long_long>._M_i;
    this_00 = (vector<QObject*,std::allocator<QObject*>> *)
              (-(ulong)((uint)uVar2 & 1) & uVar2 & 0xfffffffffffffffe);
    if (this_00 == (vector<QObject*,std::allocator<QObject*>> *)0x0) {
      this_00 = (vector<QObject*,std::allocator<QObject*>> *)operator_new(0x18);
      *(undefined8 *)this_00 = 0;
      *(pointer *)(this_00 + 8) = (pointer)0x0;
      *(pointer *)(this_00 + 0x10) = (pointer)0x0;
      std::vector<QObject_*,_std::allocator<QObject_*>_>::reserve
                ((vector<QObject_*,_std::allocator<QObject_*>_> *)this_00,8);
      (this->data).super___atomic_base<unsigned_long_long>._M_i = (ulong)this_00 | 1;
    }
    __position._M_current = *(QObject ***)(this_00 + 8);
    if (__position._M_current == *(QObject ***)(this_00 + 0x10)) {
      std::vector<QObject*,std::allocator<QObject*>>::_M_realloc_insert<QObject*const&>
                (this_00,__position,&local_20);
    }
    else {
      *__position._M_current = local_20;
      *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
    }
    pQVar3 = (QBindingStatus *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return pQVar3;
  }
  __stack_chk_fail();
}

Assistant:

QBindingStatus *QtPrivate::BindingStatusOrList::addObjectUnlessAlreadyStatus(QObject *object)
{
    if (auto status = bindingStatus())
        return status;
    List *objectList = list();
    if (!objectList) {
        objectList = new List();
        objectList->reserve(8);
        data.store(encodeList(objectList), std::memory_order_relaxed);
    }
    objectList->push_back(object);
    return nullptr;
}